

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChVector<double>::operator=
          (ChVector<double> *this,
          MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
          *vec)

{
  long lVar1;
  double *pdVar2;
  
  lVar1 = *(long *)(vec + 8);
  if (0 < lVar1) {
    pdVar2 = *(double **)vec;
    this->m_data[0] = *pdVar2;
    if ((lVar1 != 1) && (this->m_data[1] = pdVar2[1], 2 < lVar1)) {
      this->m_data[2] = pdVar2[2];
      return this;
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>, Level = 0]"
               );
}

Assistant:

ChVector& operator=(const Eigen::MatrixBase<Derived>& vec) {
        m_data[0] = vec(0);
        m_data[1] = vec(1);
        m_data[2] = vec(2);
        return *this;
    }